

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  ImVec2 new_size;
  ImVec2 IVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pIVar3 = GImGui;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    IVar5 = (GImGui->Style).WindowMinSize;
    if ((window->Flags & 0x14000000U) != 0) {
      fVar7 = IVar5.x;
      if (4.0 <= IVar5.x) {
        fVar7 = 4.0;
      }
      fVar8 = IVar5.y;
      if (4.0 <= IVar5.y) {
        fVar8 = 4.0;
      }
      IVar5.y = fVar8;
      IVar5.x = fVar7;
    }
    fVar7 = (GImGui->Style).DisplaySafeAreaPadding.x;
    fVar8 = (GImGui->Style).DisplaySafeAreaPadding.y;
    fVar7 = (GImGui->IO).DisplaySize.x - (fVar7 + fVar7);
    fVar8 = (GImGui->IO).DisplaySize.y - (fVar8 + fVar8);
    fVar9 = IVar5.x;
    uVar4 = -(uint)(fVar7 <= fVar9);
    fVar10 = IVar5.y;
    fVar2 = (float)(uVar4 & (uint)fVar9 | ~uVar4 & (uint)fVar7);
    uVar4 = -(uint)(fVar8 <= fVar10);
    fVar1 = (float)(uVar4 & (uint)fVar10 | ~uVar4 & (uint)fVar8);
    fVar8 = size_contents->x;
    fVar7 = size_contents->y;
    if (fVar7 <= fVar1) {
      fVar1 = fVar7;
    }
    fVar7 = (float)(-(uint)(fVar7 < fVar10) & (uint)fVar10 | ~-(uint)(fVar7 < fVar10) & (uint)fVar1)
    ;
    if (fVar8 <= fVar2) {
      fVar2 = fVar8;
    }
    fVar8 = (float)(-(uint)(fVar8 < fVar9) & (uint)fVar9 | ~-(uint)(fVar8 < fVar9) & (uint)fVar2);
    new_size.y = fVar7;
    new_size.x = fVar8;
    IVar5 = CalcSizeAfterConstraint(window,new_size);
    if ((IVar5.x < size_contents->x) && ((window->Flags & 0x808U) == 0x800)) {
      fVar7 = fVar7 + (pIVar3->Style).ScrollbarSize;
    }
    if ((IVar5.y < size_contents->y) && ((window->Flags & 8) == 0)) {
      fVar8 = fVar8 + (pIVar3->Style).ScrollbarSize;
    }
  }
  else {
    fVar8 = (*size_contents).x;
    fVar7 = (*size_contents).y;
  }
  IVar6.y = fVar7;
  IVar6.x = fVar8;
  return IVar6;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // Maximum window size is determined by the display size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_contents, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}